

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmSystemTools::ParseArguments_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmSystemTools *this,char *command)

{
  bool bVar1;
  cmSystemTools *pcVar2;
  bool bVar3;
  cmSystemTools *local_50;
  char *c;
  undefined1 local_40 [7];
  bool win_path;
  string arg;
  char *command_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args;
  
  arg.field_2._M_local_buf[0xf] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_40);
  bVar1 = false;
  local_50 = this;
  if ((((((*this != (cmSystemTools)0x2f) && (this[1] == (cmSystemTools)0x3a)) &&
        (this[2] == (cmSystemTools)0x5c)) ||
       (((*this == (cmSystemTools)0x22 && (this[1] != (cmSystemTools)0x2f)) &&
        ((this[2] == (cmSystemTools)0x3a && (this[3] == (cmSystemTools)0x5c)))))) ||
      (((*this == (cmSystemTools)0x27 && (this[1] != (cmSystemTools)0x2f)) &&
       ((this[2] == (cmSystemTools)0x3a && (this[3] == (cmSystemTools)0x5c)))))) ||
     ((*this == (cmSystemTools)0x5c && (this[1] == (cmSystemTools)0x5c)))) {
    bVar1 = true;
  }
  while (*local_50 != (cmSystemTools)0x0) {
    while( true ) {
      bVar3 = true;
      if (*local_50 != (cmSystemTools)0x20) {
        bVar3 = *local_50 == (cmSystemTools)0x9;
      }
      if (!bVar3) break;
      local_50 = local_50 + 1;
    }
    std::__cxx11::string::operator=((string *)local_40,"");
    pcVar2 = local_50;
    if (*local_50 == (cmSystemTools)0x22) {
      while( true ) {
        local_50 = pcVar2 + 1;
        bVar3 = false;
        if (*local_50 != (cmSystemTools)0x0) {
          bVar3 = *local_50 != (cmSystemTools)0x22;
        }
        if (!bVar3) break;
        std::__cxx11::string::append((ulong)local_40,'\x01');
        pcVar2 = local_50;
      }
      if (*local_50 != (cmSystemTools)0x0) {
        local_50 = pcVar2 + 2;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_40);
    }
    else if (*local_50 == (cmSystemTools)0x27) {
      while( true ) {
        local_50 = pcVar2 + 1;
        bVar3 = false;
        if (*local_50 != (cmSystemTools)0x0) {
          bVar3 = *local_50 != (cmSystemTools)0x27;
        }
        if (!bVar3) break;
        std::__cxx11::string::append((ulong)local_40,'\x01');
        pcVar2 = local_50;
      }
      if (*local_50 != (cmSystemTools)0x0) {
        local_50 = pcVar2 + 2;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_40);
    }
    else if (*local_50 != (cmSystemTools)0x0) {
      while( true ) {
        local_50 = pcVar2;
        bVar3 = false;
        if ((*local_50 != (cmSystemTools)0x0) && (bVar3 = false, *local_50 != (cmSystemTools)0x20))
        {
          bVar3 = *local_50 != (cmSystemTools)0x9;
        }
        if (!bVar3) break;
        if ((*local_50 != (cmSystemTools)0x5c) || (bVar1)) {
          std::__cxx11::string::append((ulong)local_40,'\x01');
          pcVar2 = local_50 + 1;
        }
        else {
          pcVar2 = local_50 + 1;
          if (local_50[1] != (cmSystemTools)0x0) {
            std::__cxx11::string::append((ulong)local_40,'\x01');
            pcVar2 = local_50 + 2;
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_40);
    }
  }
  arg.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((arg.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmSystemTools::ParseArguments(const char* command)
{
  std::vector<std::string> args;
  std::string arg;

  bool win_path = false;

  if ((command[0] != '/' && command[1] == ':' && command[2] == '\\') ||
      (command[0] == '\"' && command[1] != '/' && command[2] == ':'
       && command[3] == '\\') ||
      (command[0] == '\'' && command[1] != '/' && command[2] == ':'
       && command[3] == '\\') ||
      (command[0] == '\\' && command[1] == '\\'))
    {
    win_path = true;
    }
  // Split the command into an argv array.
  for(const char* c = command; *c;)
    {
    // Skip over whitespace.
    while(*c == ' ' || *c == '\t')
      {
      ++c;
      }
    arg = "";
    if(*c == '"')
      {
      // Parse a quoted argument.
      ++c;
      while(*c && *c != '"')
        {
        arg.append(1, *c);
        ++c;
        }
      if(*c)
        {
        ++c;
        }
      args.push_back(arg);
      }
    else if(*c == '\'')
      {
      // Parse a quoted argument.
      ++c;
      while(*c && *c != '\'')
        {
        arg.append(1, *c);
        ++c;
        }
      if(*c)
        {
        ++c;
        }
      args.push_back(arg);
      }
    else if(*c)
      {
      // Parse an unquoted argument.
      while(*c && *c != ' ' && *c != '\t')
        {
        if(*c == '\\' && !win_path)
          {
          ++c;
          if(*c)
            {
            arg.append(1, *c);
            ++c;
            }
          }
        else
          {
          arg.append(1, *c);
          ++c;
          }
        }
      args.push_back(arg);
      }
    }

  return args;
}